

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineBlocker.cpp
# Opt level: O2

void __thiscall
tiger::trains::ai::LineBlocker::changeCurrentBlock
          (LineBlocker *this,
          vector<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
          *points)

{
  pointer ppVar1;
  pointer ppLVar2;
  Line *this_00;
  bool bVar3;
  int iVar4;
  Player *this_01;
  vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_> *pvVar5;
  Point *pPVar6;
  Point *pPVar7;
  pointer ppLVar8;
  pointer ppVar9;
  pair<int,_tiger::trains::ai::LineBlock> block;
  key_type local_48;
  
  ppVar1 = (this->currentBlock).
           super__Vector_base<std::pair<int,_tiger::trains::ai::LineBlock>,_std::allocator<std::pair<int,_tiger::trains::ai::LineBlock>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar9 = (this->currentBlock).
                super__Vector_base<std::pair<int,_tiger::trains::ai::LineBlock>,_std::allocator<std::pair<int,_tiger::trains::ai::LineBlock>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar9 != ppVar1; ppVar9 = ppVar9 + 1) {
    local_48.second.inPoint = (ppVar9->second).inPoint;
    local_48.first = ppVar9->first;
    local_48._4_4_ = *(undefined4 *)&ppVar9->field_0x4;
    local_48.second.line = (ppVar9->second).line;
    std::
    _Rb_tree<std::pair<int,_tiger::trains::ai::LineBlock>,_std::pair<int,_tiger::trains::ai::LineBlock>,_std::_Identity<std::pair<int,_tiger::trains::ai::LineBlock>_>,_std::less<std::pair<int,_tiger::trains::ai::LineBlock>_>,_std::allocator<std::pair<int,_tiger::trains::ai::LineBlock>_>_>
    ::erase(&this->blockLines->_M_t,&local_48);
  }
  ppVar9 = (this->currentBlock).
           super__Vector_base<std::pair<int,_tiger::trains::ai::LineBlock>,_std::allocator<std::pair<int,_tiger::trains::ai::LineBlock>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->currentBlock).
      super__Vector_base<std::pair<int,_tiger::trains::ai::LineBlock>,_std::allocator<std::pair<int,_tiger::trains::ai::LineBlock>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar9) {
    (this->currentBlock).
    super__Vector_base<std::pair<int,_tiger::trains::ai::LineBlock>,_std::allocator<std::pair<int,_tiger::trains::ai::LineBlock>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppVar9;
  }
  this_01 = world::Train::getPlayer(this->train);
  world::Player::getHome(this_01);
  pvVar5 = world::Point::getEdges
                     ((points->
                      super__Vector_base<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
                      )._M_impl.super__Vector_impl_data._M_start[1]);
  ppLVar2 = (pvVar5->
            super__Vector_base<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  for (ppLVar8 = (pvVar5->
                 super__Vector_base<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>
                 )._M_impl.super__Vector_impl_data._M_start; ppLVar8 != ppLVar2;
      ppLVar8 = ppLVar8 + 1) {
    this_00 = *ppLVar8;
    pPVar6 = world::Line::getAnotherPoint
                       (this_00,(points->
                                super__Vector_base<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
                                )._M_impl.super__Vector_impl_data._M_start[1]);
    pPVar7 = *(points->
              super__Vector_base<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if (pPVar6 == pPVar7) {
      bVar3 = BotSharedData::doMove(this->sharedData,pPVar7,this_00);
      if (bVar3) {
        iVar4 = world::Train::getIdx(this->train);
        local_48.second.inPoint =
             (points->
             super__Vector_base<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
             )._M_impl.super__Vector_impl_data._M_start[1];
        local_48.first = iVar4;
        local_48.second.line = this_00;
        std::
        vector<std::pair<int,tiger::trains::ai::LineBlock>,std::allocator<std::pair<int,tiger::trains::ai::LineBlock>>>
        ::emplace_back<std::pair<int,tiger::trains::ai::LineBlock>>
                  ((vector<std::pair<int,tiger::trains::ai::LineBlock>,std::allocator<std::pair<int,tiger::trains::ai::LineBlock>>>
                    *)&this->currentBlock,&local_48);
        std::
        _Rb_tree<std::pair<int,tiger::trains::ai::LineBlock>,std::pair<int,tiger::trains::ai::LineBlock>,std::_Identity<std::pair<int,tiger::trains::ai::LineBlock>>,std::less<std::pair<int,tiger::trains::ai::LineBlock>>,std::allocator<std::pair<int,tiger::trains::ai::LineBlock>>>
        ::_M_insert_unique<std::pair<int,tiger::trains::ai::LineBlock>const&>
                  ((_Rb_tree<std::pair<int,tiger::trains::ai::LineBlock>,std::pair<int,tiger::trains::ai::LineBlock>,std::_Identity<std::pair<int,tiger::trains::ai::LineBlock>>,std::less<std::pair<int,tiger::trains::ai::LineBlock>>,std::allocator<std::pair<int,tiger::trains::ai::LineBlock>>>
                    *)this->blockLines,
                   (this->currentBlock).
                   super__Vector_base<std::pair<int,_tiger::trains::ai::LineBlock>,_std::allocator<std::pair<int,_tiger::trains::ai::LineBlock>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + -1);
      }
    }
    pPVar7 = world::Line::getAnotherPoint
                       (this_00,(points->
                                super__Vector_base<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
                                )._M_impl.super__Vector_impl_data._M_start[1]);
    if (pPVar7 == (points->
                  super__Vector_base<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
                  )._M_impl.super__Vector_impl_data._M_start[2]) {
      iVar4 = world::Train::getIdx(this->train);
      local_48.second.inPoint =
           *(points->
            super__Vector_base<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
      local_48.first = iVar4;
      local_48.second.line = this_00;
      std::
      vector<std::pair<int,tiger::trains::ai::LineBlock>,std::allocator<std::pair<int,tiger::trains::ai::LineBlock>>>
      ::emplace_back<std::pair<int,tiger::trains::ai::LineBlock>>
                ((vector<std::pair<int,tiger::trains::ai::LineBlock>,std::allocator<std::pair<int,tiger::trains::ai::LineBlock>>>
                  *)&this->currentBlock,&local_48);
      std::
      _Rb_tree<std::pair<int,tiger::trains::ai::LineBlock>,std::pair<int,tiger::trains::ai::LineBlock>,std::_Identity<std::pair<int,tiger::trains::ai::LineBlock>>,std::less<std::pair<int,tiger::trains::ai::LineBlock>>,std::allocator<std::pair<int,tiger::trains::ai::LineBlock>>>
      ::_M_insert_unique<std::pair<int,tiger::trains::ai::LineBlock>const&>
                ((_Rb_tree<std::pair<int,tiger::trains::ai::LineBlock>,std::pair<int,tiger::trains::ai::LineBlock>,std::_Identity<std::pair<int,tiger::trains::ai::LineBlock>>,std::less<std::pair<int,tiger::trains::ai::LineBlock>>,std::allocator<std::pair<int,tiger::trains::ai::LineBlock>>>
                  *)this->blockLines,
                 (this->currentBlock).
                 super__Vector_base<std::pair<int,_tiger::trains::ai::LineBlock>,_std::allocator<std::pair<int,_tiger::trains::ai::LineBlock>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1);
    }
  }
  return;
}

Assistant:

void LineBlocker::changeCurrentBlock(const std::vector<const world::Point *> &points)
{
    for (auto block : currentBlock)
    {
        blockLines->erase(block);
    }

    currentBlock.clear();

    const world::Town *homeTown = (world::Town *)train->getPlayer()->getHome();


    for (auto line : points[1]->getEdges())
    {

        if (line->getAnotherPoint(points[1]) == points[0])
        {
            if (sharedData->doMove(points[0], line))
            {
                currentBlock.push_back({train->getIdx(), {line, points[1]} });
                blockLines->insert(currentBlock.back());
            }
        }

        if (line->getAnotherPoint(points[1]) == points[2])
        {
            currentBlock.push_back({train->getIdx(), {line, points[0]} });
            blockLines->insert(currentBlock.back());
        }

        /* if (line->getAnotherPoint(points[1]) != points[2] &&
                 line->getAnotherPoint(points[1]) != points[0] &&
                 points[1] != homeTown->getPoint())
         {
             currentBlock.push_back({train->getIdx(), {line, line->getAnotherPoint(points[1])} });
             blockLines->insert(currentBlock.back());
         }*/

    }


}